

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdebug.h
# Opt level: O1

QDebug __thiscall
QtPrivate::printSequentialContainer<QList<QItemSelectionRange>>
          (QtPrivate *this,QDebug debug,char *which,QList<QItemSelectionRange> *c)

{
  char *pcVar1;
  QTextStream *pQVar2;
  long lVar3;
  undefined8 uVar4;
  storage_type *psVar5;
  QItemSelectionRange *pQVar6;
  storage_type *psVar7;
  QItemSelectionRange *pQVar8;
  long in_FS_OFFSET;
  QByteArrayView QVar9;
  QByteArrayView QVar10;
  QDebugStateSaver saver;
  QItemSelectionRange local_78;
  QItemSelectionRange local_68;
  undefined1 *local_58;
  QArrayData *local_50 [3];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_58 = &DAT_aaaaaaaaaaaaaaaa;
  QDebugStateSaver::QDebugStateSaver((QDebugStateSaver *)&local_58,(QDebug *)debug.stream);
  pQVar2 = *(QTextStream **)debug.stream;
  pQVar2[0x30] = (QTextStream)0x0;
  if (which == (char *)0x0) {
    psVar7 = (storage_type *)0x0;
  }
  else {
    psVar5 = (storage_type *)0xffffffffffffffff;
    do {
      psVar7 = psVar5 + 1;
      pcVar1 = which + 1 + (long)psVar5;
      psVar5 = psVar7;
    } while (*pcVar1 != '\0');
  }
  QVar9.m_data = psVar7;
  QVar9.m_size = (qsizetype)local_50;
  QString::fromUtf8(QVar9);
  QTextStream::operator<<(pQVar2,(QString *)local_50);
  if (local_50[0] != (QArrayData *)0x0) {
    LOCK();
    (local_50[0]->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_50[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_50[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_50[0],2,0x10);
    }
  }
  if ((*(QTextStream **)debug.stream)[0x30] == (QTextStream)0x1) {
    QTextStream::operator<<(*(QTextStream **)debug.stream,' ');
  }
  QTextStream::operator<<(*(QTextStream **)debug.stream,'(');
  if ((*(QTextStream **)debug.stream)[0x30] == (QTextStream)0x1) {
    QTextStream::operator<<(*(QTextStream **)debug.stream,' ');
  }
  pQVar8 = (c->d).ptr;
  lVar3 = (c->d).size;
  pQVar6 = pQVar8 + lVar3;
  if (lVar3 != 0) {
    local_68.tl.d = *(QPersistentModelIndexData **)debug.stream;
    *(int *)(local_68.tl.d + 0x28) = *(int *)(local_68.tl.d + 0x28) + 1;
    ::operator<<((QDebug)&local_68.br,&local_68);
    QDebug::~QDebug((QDebug *)&local_68.br);
    QDebug::~QDebug((QDebug *)&local_68);
    pQVar8 = pQVar8 + 1;
  }
  if (pQVar8 != pQVar6) {
    do {
      pQVar2 = *(QTextStream **)debug.stream;
      QVar10.m_data = (storage_type *)0x2;
      QVar10.m_size = (qsizetype)local_50;
      QString::fromUtf8(QVar10);
      QTextStream::operator<<(pQVar2,(QString *)local_50);
      if (local_50[0] != (QArrayData *)0x0) {
        LOCK();
        (local_50[0]->ref_)._q_value.super___atomic_base<int>._M_i =
             (local_50[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((local_50[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(local_50[0],2,0x10);
        }
      }
      if ((*(QTextStream **)debug.stream)[0x30] == (QTextStream)0x1) {
        QTextStream::operator<<(*(QTextStream **)debug.stream,' ');
      }
      local_78.tl.d = *(QPersistentModelIndexData **)debug.stream;
      *(int *)(local_78.tl.d + 0x28) = *(int *)(local_78.tl.d + 0x28) + 1;
      ::operator<<((QDebug)&local_78.br,&local_78);
      QDebug::~QDebug((QDebug *)&local_78.br);
      QDebug::~QDebug((QDebug *)&local_78);
      pQVar8 = pQVar8 + 1;
    } while (pQVar8 != pQVar6);
  }
  QTextStream::operator<<(*(QTextStream **)debug.stream,')');
  if ((*(QTextStream **)debug.stream)[0x30] == (QTextStream)0x1) {
    QTextStream::operator<<(*(QTextStream **)debug.stream,' ');
  }
  uVar4 = *(undefined8 *)debug.stream;
  *(undefined8 *)debug.stream = 0;
  *(undefined8 *)this = uVar4;
  QDebugStateSaver::~QDebugStateSaver((QDebugStateSaver *)&local_58);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return (QDebug)(Stream *)this;
}

Assistant:

inline QDebug printSequentialContainer(QDebug debug, const char *which, const SequentialContainer &c)
{
    const QDebugStateSaver saver(debug);
    debug.nospace() << which << '(';
    typename SequentialContainer::const_iterator it = c.begin(), end = c.end();
    if (it != end) {
        debug << *it;
        ++it;
    }
    while (it != end) {
        debug << ", " << *it;
        ++it;
    }
    debug << ')';
    return debug;
}